

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

void __thiscall amrex::FluxRegister::ClearInternalBorders(FluxRegister *this,Geometry *geom)

{
  undefined8 uVar1;
  Box *pBVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  Geometry *in_RSI;
  FluxRegister *in_RDI;
  Box result_3;
  Box *bx2_1;
  int ii_3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects2_1;
  Box result_2;
  Box *sbx_1;
  int ii_2;
  Array4<double> *frarr_1;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects_1;
  Box *bx_1;
  FabSetIter fsi_1;
  Box result_1;
  Box *bx2;
  int ii_1;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects2;
  Box result;
  Box *sbx;
  int ii;
  Array4<double> *frarr;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects;
  Box *bx;
  FabSetIter fsi;
  BoxArray *bahi;
  BoxArray *balo;
  FabSet *frhi;
  FabSet *frlo;
  Orientation hi;
  Orientation lo;
  int dir;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> tags;
  Box *domain;
  int nc;
  BndryRegister *in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9b0;
  Orientation in_stack_fffffffffffff9b4;
  undefined4 in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  Box *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  int in_stack_fffffffffffff9d4;
  FArrayBox *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  Box *in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  undefined1 local_5b4 [16];
  int local_5a4 [2];
  IndexType local_59c;
  undefined1 *local_598;
  int local_58c;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_588;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_570;
  Box local_568;
  Box *local_548;
  undefined8 local_540;
  int local_534;
  Array4<double> local_530;
  Array4<double> *local_4f0;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_4e8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_4d0;
  Box local_4c4;
  Box *local_4a8;
  MFIter local_4a0;
  undefined8 local_440;
  Box local_434;
  Box *local_418;
  int local_40c;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_408;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_3f0;
  Box local_3e8;
  Box *local_3c0;
  undefined8 local_3b8;
  int local_3ac;
  Array4<double> local_3a8;
  Array4<double> *local_368;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_360;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_348;
  Box local_33c;
  Box *local_320;
  MFIter local_308;
  BoxArray *local_2a8;
  BoxArray *local_2a0;
  int local_294;
  FabSet *local_290;
  int local_284;
  FabSet *local_280;
  Orientation local_274;
  Orientation local_270;
  int local_26c;
  Box *local_250;
  int local_244;
  Geometry *local_240;
  FArrayBox *local_230;
  FArrayBox *local_228;
  int local_220;
  int local_21c;
  BndryRegister *local_218;
  int local_210;
  int local_20c;
  Box *local_208;
  int local_200;
  int local_1fc;
  Box *local_1f8;
  int local_1f0;
  int local_1ec;
  Box *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Dim3 local_17c;
  Dim3 local_170;
  Dim3 local_160;
  int local_154;
  Box *local_150;
  double *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  Box *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  Box *local_f8;
  Dim3 local_f0;
  Box *local_e0;
  int local_d8;
  int iStack_d4;
  int local_d0;
  undefined4 local_cc;
  Box *local_c8;
  undefined4 local_bc;
  Box *local_b8;
  undefined4 local_ac;
  Box *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_240 = in_RSI;
  local_244 = nComp(in_RDI);
  local_250 = Geometry::Domain(local_240);
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::Vector
            ((Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> *)
             0x13013b5);
  for (local_26c = 0; local_26c < 3; local_26c = local_26c + 1) {
    Orientation::Orientation(&local_270,local_26c,low);
    Orientation::Orientation(&local_274,local_26c,high);
    local_284 = local_270.val;
    local_280 = BndryRegister::operator[](in_stack_fffffffffffff9a8,in_stack_fffffffffffff9b4);
    local_294 = local_274.val;
    local_290 = BndryRegister::operator[](in_stack_fffffffffffff9a8,in_stack_fffffffffffff9b4);
    local_2a0 = FabSet::boxArray((FabSet *)0x130145e);
    local_2a8 = FabSet::boxArray((FabSet *)0x1301473);
    FabSetIter::FabSetIter
              ((FabSetIter *)CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
               (FabSet *)in_stack_fffffffffffff9a8);
    while (bVar3 = MFIter::isValid(&local_308), bVar3) {
      MFIter::validbox((MFIter *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_320 = &local_33c;
      BoxArray::intersections
                ((BoxArray *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 in_stack_fffffffffffff9f0);
      local_348 = &local_360;
      local_228 = FabSet::operator[]((FabSet *)
                                     CONCAT44(in_stack_fffffffffffff9b4.val,
                                              in_stack_fffffffffffff9b0),
                                     (MFIter *)in_stack_fffffffffffff9a8);
      local_198 = (local_228->super_BaseFab<double>).dptr;
      local_1a0 = &(local_228->super_BaseFab<double>).domain;
      local_1a4 = (local_228->super_BaseFab<double>).nvar;
      local_ac = 0;
      local_d8 = (local_1a0->smallend).vect[0];
      local_bc = 1;
      iStack_d4 = (local_228->super_BaseFab<double>).domain.smallend.vect[1];
      local_1c0.x = (local_1a0->smallend).vect[0];
      local_1c0.y = (local_1a0->smallend).vect[1];
      local_cc = 2;
      local_1c0.z = (local_228->super_BaseFab<double>).domain.smallend.vect[2];
      local_8 = &(local_228->super_BaseFab<double>).domain.bigend;
      local_c = 0;
      local_38 = local_8->vect[0] + 1;
      local_18 = &(local_228->super_BaseFab<double>).domain.bigend;
      local_1c = 1;
      iStack_34 = (local_228->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      local_28 = &(local_228->super_BaseFab<double>).domain.bigend;
      local_2c = 2;
      local_1e0.z = (local_228->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      local_1e0.y = iStack_34;
      local_1e0.x = local_38;
      local_1cc._0_8_ = local_1e0._0_8_;
      local_1cc.z = local_1e0.z;
      local_1b0._0_8_ = local_1c0._0_8_;
      local_1b0.z = local_1c0.z;
      local_f0._0_8_ = local_1c0._0_8_;
      local_f0.z = local_1c0.z;
      local_e0 = local_1a0;
      local_d0 = local_1c0.z;
      local_c8 = local_1a0;
      local_b8 = local_1a0;
      local_a8 = local_1a0;
      local_50._0_8_ = local_1e0._0_8_;
      local_50.z = local_1e0.z;
      local_40 = local_1a0;
      local_30 = local_1e0.z;
      Array4<double>::Array4(&local_3a8,local_198,&local_1b0,&local_1cc,local_1a4);
      local_368 = &local_3a8;
      for (local_3ac = 0; iVar6 = local_3ac,
          sVar7 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  size(local_348), iVar6 < (int)sVar7; local_3ac = local_3ac + 1) {
        FabSet::operator[]((FabSet *)
                           CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
                           (MFIter *)in_stack_fffffffffffff9a8);
        local_3b8 = 0;
        std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
        operator[](local_348,(long)local_3ac);
        BaseFab<double>::setVal<(amrex::RunOn)1>
                  ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                   (double *)in_stack_fffffffffffff9d8,
                   (Box *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(int)in_stack_fffffffffffff9c8);
      }
      bVar3 = Geometry::isPeriodic(local_240,local_26c);
      if (bVar3) {
        iVar4 = Box::smallEnd(local_320,local_26c);
        iVar5 = Box::smallEnd(local_250,local_26c);
        iVar6 = local_26c;
        pBVar2 = local_320;
        if (iVar4 == iVar5) {
          local_1f0 = Box::length(local_250,local_26c);
          local_1e8 = pBVar2;
          local_1ec = iVar6;
          local_3e8.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
          uVar1 = *(undefined8 *)((pBVar2->smallend).vect + 2);
          local_3e8._20_8_ = *(undefined8 *)((pBVar2->bigend).vect + 2);
          local_3e8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar2->bigend).vect >> 0x20);
          local_3e8.smallend.vect[2] = (int)uVar1;
          local_3e8.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
          Box::shift(&local_3e8,iVar6,local_1f0);
          local_3c0 = &local_3e8;
          BoxArray::intersections
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     in_stack_fffffffffffff9f0);
          local_3f0 = &local_408;
          local_40c = 0;
          while (in_stack_fffffffffffff9fc = local_40c,
                sVar7 = std::
                        vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ::size(local_3f0), in_stack_fffffffffffff9fc < (int)sVar7) {
            pvVar8 = std::
                     vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ::operator[](local_3f0,(long)local_40c);
            in_stack_fffffffffffff9f0 = &pvVar8->second;
            in_stack_fffffffffffff9f8 = local_26c;
            local_200 = Box::length(local_250,local_26c);
            local_200 = -local_200;
            local_434.smallend.vect._0_8_ =
                 *(undefined8 *)(in_stack_fffffffffffff9f0->smallend).vect;
            local_434._8_8_ = *(undefined8 *)((in_stack_fffffffffffff9f0->smallend).vect + 2);
            local_434.bigend.vect._4_8_ =
                 *(undefined8 *)((in_stack_fffffffffffff9f0->bigend).vect + 1);
            local_434.btype.itype = (in_stack_fffffffffffff9f0->btype).itype;
            local_1fc = in_stack_fffffffffffff9f8;
            local_1f8 = in_stack_fffffffffffff9f0;
            Box::shift(&local_434,in_stack_fffffffffffff9f8,local_200);
            local_418 = &local_434;
            FabSet::operator[]((FabSet *)
                               CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
                               (MFIter *)in_stack_fffffffffffff9a8);
            local_440 = 0;
            BaseFab<double>::setVal<(amrex::RunOn)1>
                      ((BaseFab<double> *)
                       CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                       (double *)in_stack_fffffffffffff9d8,
                       (Box *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                       (int)in_stack_fffffffffffff9c8);
            local_40c = local_40c + 1;
          }
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          ~vector((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
        }
      }
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      MFIter::operator++(&local_308);
    }
    FabSetIter::~FabSetIter((FabSetIter *)0x13014b2);
    FabSetIter::FabSetIter
              ((FabSetIter *)CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
               (FabSet *)in_stack_fffffffffffff9a8);
    while (bVar3 = MFIter::isValid(&local_4a0), bVar3) {
      MFIter::validbox((MFIter *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4a8 = &local_4c4;
      BoxArray::intersections
                ((BoxArray *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 in_stack_fffffffffffff9f0);
      local_4d0 = &local_4e8;
      local_230 = FabSet::operator[]((FabSet *)
                                     CONCAT44(in_stack_fffffffffffff9b4.val,
                                              in_stack_fffffffffffff9b0),
                                     (MFIter *)in_stack_fffffffffffff9a8);
      local_148 = (local_230->super_BaseFab<double>).dptr;
      local_150 = &(local_230->super_BaseFab<double>).domain;
      local_154 = (local_230->super_BaseFab<double>).nvar;
      local_fc = 0;
      local_128 = (local_150->smallend).vect[0];
      local_10c = 1;
      iStack_124 = (local_230->super_BaseFab<double>).domain.smallend.vect[1];
      local_170.x = (local_150->smallend).vect[0];
      local_170.y = (local_150->smallend).vect[1];
      local_11c = 2;
      local_170.z = (local_230->super_BaseFab<double>).domain.smallend.vect[2];
      local_58 = &(local_230->super_BaseFab<double>).domain.bigend;
      local_5c = 0;
      local_88 = local_58->vect[0] + 1;
      local_68 = &(local_230->super_BaseFab<double>).domain.bigend;
      local_6c = 1;
      iStack_84 = (local_230->super_BaseFab<double>).domain.bigend.vect[1] + 1;
      local_78 = &(local_230->super_BaseFab<double>).domain.bigend;
      local_7c = 2;
      local_190.z = (local_230->super_BaseFab<double>).domain.bigend.vect[2] + 1;
      local_190.y = iStack_84;
      local_190.x = local_88;
      local_17c._0_8_ = local_190._0_8_;
      local_17c.z = local_190.z;
      local_160._0_8_ = local_170._0_8_;
      local_160.z = local_170.z;
      local_140._0_8_ = local_170._0_8_;
      local_140.z = local_170.z;
      local_130 = local_150;
      local_120 = local_170.z;
      local_118 = local_150;
      local_108 = local_150;
      local_f8 = local_150;
      local_a0._0_8_ = local_190._0_8_;
      local_a0.z = local_190.z;
      local_90 = local_150;
      local_80 = local_190.z;
      Array4<double>::Array4(&local_530,local_148,&local_160,&local_17c,local_154);
      local_4f0 = &local_530;
      local_534 = 0;
      while (in_stack_fffffffffffff9e4 = local_534,
            sVar7 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::size(local_4d0), in_stack_fffffffffffff9e4 < (int)sVar7) {
        in_stack_fffffffffffff9d8 =
             FabSet::operator[]((FabSet *)
                                CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
                                (MFIter *)in_stack_fffffffffffff9a8);
        local_540 = 0;
        std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
        operator[](local_4d0,(long)local_534);
        BaseFab<double>::setVal<(amrex::RunOn)1>
                  ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                   (double *)in_stack_fffffffffffff9d8,
                   (Box *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(int)in_stack_fffffffffffff9c8);
        local_534 = local_534 + 1;
      }
      bVar3 = Geometry::isPeriodic(local_240,local_26c);
      if (bVar3) {
        in_stack_fffffffffffff9d4 = Box::bigEnd(local_4a8,local_26c);
        iVar6 = Box::bigEnd(local_250,local_26c);
        pBVar2 = local_4a8;
        if (in_stack_fffffffffffff9d4 == iVar6) {
          in_stack_fffffffffffff9c4 = local_26c;
          local_210 = Box::length(local_250,local_26c);
          local_210 = -local_210;
          local_208 = pBVar2;
          local_568.smallend.vect._0_8_ = *(undefined8 *)(pBVar2->smallend).vect;
          uVar1 = *(undefined8 *)((pBVar2->smallend).vect + 2);
          local_568._20_8_ = *(undefined8 *)((pBVar2->bigend).vect + 2);
          local_568.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar2->bigend).vect >> 0x20);
          local_568.smallend.vect[2] = (int)uVar1;
          local_568.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
          in_stack_fffffffffffff9c8 = &local_568;
          local_20c = in_stack_fffffffffffff9c4;
          Box::shift(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,local_210);
          local_548 = in_stack_fffffffffffff9c8;
          BoxArray::intersections
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     in_stack_fffffffffffff9f0);
          local_570 = &local_588;
          local_58c = 0;
          while (in_stack_fffffffffffff9b4.val = local_58c,
                sVar7 = std::
                        vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ::size(local_570), in_stack_fffffffffffff9b4.val < (int)sVar7) {
            pvVar8 = std::
                     vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ::operator[](local_570,(long)local_58c);
            in_stack_fffffffffffff9a8 = (BndryRegister *)&pvVar8->second;
            in_stack_fffffffffffff9b0 = local_26c;
            local_220 = Box::length(local_250,local_26c);
            local_5b4._0_8_ =
                 *(undefined8 *)((IntVect *)&in_stack_fffffffffffff9a8->_vptr_BndryRegister)->vect;
            local_5b4._8_8_ =
                 in_stack_fffffffffffff9a8->bndry[0].m_mf.super_FabArray<amrex::FArrayBox>.
                 super_FabArrayBase._vptr_FabArrayBase;
            local_5a4 = *(int (*) [2])
                         &in_stack_fffffffffffff9a8->bndry[0].m_mf.super_FabArray<amrex::FArrayBox>.
                          super_FabArrayBase.boxarray.m_bat;
            local_59c.itype =
                 *(uint *)((long)&in_stack_fffffffffffff9a8->bndry[0].m_mf.
                                  super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat
                                  .m_op + 4);
            local_21c = in_stack_fffffffffffff9b0;
            local_218 = in_stack_fffffffffffff9a8;
            Box::shift((Box *)local_5b4,in_stack_fffffffffffff9b0,local_220);
            local_598 = local_5b4;
            FabSet::operator[]((FabSet *)
                               CONCAT44(in_stack_fffffffffffff9b4.val,in_stack_fffffffffffff9b0),
                               (MFIter *)in_stack_fffffffffffff9a8);
            BaseFab<double>::setVal<(amrex::RunOn)1>
                      ((BaseFab<double> *)
                       CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                       (double *)in_stack_fffffffffffff9d8,
                       (Box *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                       (int)in_stack_fffffffffffff9c8);
            local_58c = local_58c + 1;
          }
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          ~vector((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
        }
      }
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      MFIter::operator++(&local_4a0);
    }
    FabSetIter::~FabSetIter((FabSetIter *)0x1301b99);
  }
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::~Vector
            ((Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> *)
             0x1302240);
  return;
}

Assistant:

void
FluxRegister::ClearInternalBorders (const Geometry& geom)
{
    int nc = this->nComp();
    const Box& domain = geom.Domain();

    Vector<Array4BoxTag<Real> > tags;

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++) {
        Orientation lo(dir, Orientation::low);
        Orientation hi(dir, Orientation::high);

        FabSet& frlo = (*this)[lo];
        FabSet& frhi = (*this)[hi];

        const BoxArray& balo = frlo.boxArray();
        const BoxArray& bahi = frhi.boxArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        {
            for (FabSetIter fsi(frlo); fsi.isValid(); ++fsi) {
                const Box& bx = fsi.validbox();
                const std::vector< std::pair<int,Box> >& isects = bahi.intersections(bx);
                auto const& frarr = frlo[fsi].array();
                for (int ii = 0; ii < static_cast<int>(isects.size()); ++ii) {
                    if (Gpu::inLaunchRegion()) {
                        tags.emplace_back(Array4BoxTag<Real>{frarr, isects[ii].second});
                    } else {
                        frlo[fsi].setVal<RunOn::Host>(0.0, isects[ii].second, 0, nc);
                    }
                }
                if (geom.isPeriodic(dir)) {
                    if (bx.smallEnd(dir) == domain.smallEnd(dir)) {
                        const Box& sbx = amrex::shift(bx, dir, domain.length(dir));
                        const std::vector<std::pair<int,Box> >& isects2 = bahi.intersections(sbx);
                        for (int ii = 0; ii < static_cast<int>(isects2.size()); ++ii) {
                            const Box& bx2 = amrex::shift(isects2[ii].second, dir, -domain.length(dir));
                            if (Gpu::inLaunchRegion()) {
                                tags.emplace_back(Array4BoxTag<Real>{frarr, bx2});
                            } else {
                                frlo[fsi].setVal<RunOn::Host>(0.0, bx2, 0, nc);
                            }
                        }
                    }
                }
            }

            for (FabSetIter fsi(frhi); fsi.isValid(); ++fsi) {
                const Box& bx = fsi.validbox();
                const std::vector< std::pair<int,Box> >& isects = balo.intersections(bx);
                auto const& frarr = frhi[fsi].array();
                for (int ii = 0; ii < static_cast<int>(isects.size()); ++ii) {
                    if (Gpu::inLaunchRegion()) {
                        tags.emplace_back(Array4BoxTag<Real>{frarr, isects[ii].second});
                    } else {
                        frhi[fsi].setVal<RunOn::Host>(0.0, isects[ii].second, 0, nc);
                    }
                }
                if (geom.isPeriodic(dir)) {
                    if (bx.bigEnd(dir) == domain.bigEnd(dir)) {
                        const Box& sbx = amrex::shift(bx, dir, -domain.length(dir));
                        const std::vector<std::pair<int,Box> >& isects2 = balo.intersections(sbx);
                        for (int ii = 0; ii < static_cast<int>(isects2.size()); ++ii) {
                            const Box& bx2 = amrex::shift(isects2[ii].second, dir, domain.length(dir));
                            if (Gpu::inLaunchRegion()) {
                                tags.emplace_back(Array4BoxTag<Real>{frarr, bx2});
                            } else {
                                frhi[fsi].setVal<RunOn::Host>(0.0, bx2, 0, nc);
                            }
                        }
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    // There is Gpu::streamSynchronize in Parallelfor below internally.
    ParallelFor(tags, nc,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag)
    {
        tag.dfab(i,j,k,n) = 0.0;
    });
#endif
}